

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void ReadSigNetArgs(ArgsManager *args,SigNetOptions *options)

{
  bool bVar1;
  size_type sVar2;
  runtime_error *prVar3;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  __sv_type str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  signet_challenge;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe40;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  ArgsManager *in_stack_fffffffffffffe60;
  allocator<char> *fmt;
  allocator<char> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  char *in_stack_fffffffffffffe80;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *strArg;
  ArgsManager *this;
  allocator<char> local_109 [31];
  allocator<char> local_ea;
  allocator<char> local_e9 [32];
  undefined1 local_c9 [193];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (ArgsManager *)local_c9;
  strArg = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  bVar1 = ArgsManager::IsArgSet(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  if (bVar1) {
    in_stack_fffffffffffffe88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ArgsManager::GetArgs(this,strArg);
    std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::
    emplace<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe48);
    std::__cxx11::string::~string(in_stack_fffffffffffffe38);
    std::allocator<char>::~allocator(local_e9);
  }
  __s = &local_ea;
  __a = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe88,(char *)__s,(allocator<char> *)__a);
  bVar1 = ArgsManager::IsArgSet(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::__cxx11::string::~string(in_stack_fffffffffffffe38);
  std::allocator<char>::~allocator(&local_ea);
  if (bVar1) {
    fmt = local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe88,(char *)__s,(allocator<char> *)__a);
    ArgsManager::GetArgs(this,strArg);
    std::__cxx11::string::~string(in_stack_fffffffffffffe38);
    std::allocator<char>::~allocator(local_109);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe38);
    if (sVar2 != 1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"-signetchallenge cannot be multiple values.");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00d6dec8;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe48,(size_type)in_stack_fffffffffffffe40);
    str = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe58);
    TryParseHex<unsigned_char>(str);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                       in_stack_fffffffffffffe38);
    if (!bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe48,(size_type)in_stack_fffffffffffffe40);
      tinyformat::format<std::__cxx11::string>((char *)fmt,in_RDI);
      std::runtime_error::runtime_error(prVar3,(string *)(local_c9 + 0x21));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00d6dec8;
    }
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator*
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffe38);
    std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
    emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
              (in_RSI,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_fffffffffffffe40);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffe38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00d6dec8:
  __stack_chk_fail();
}

Assistant:

void ReadSigNetArgs(const ArgsManager& args, CChainParams::SigNetOptions& options)
{
    if (args.IsArgSet("-signetseednode")) {
        options.seeds.emplace(args.GetArgs("-signetseednode"));
    }
    if (args.IsArgSet("-signetchallenge")) {
        const auto signet_challenge = args.GetArgs("-signetchallenge");
        if (signet_challenge.size() != 1) {
            throw std::runtime_error("-signetchallenge cannot be multiple values.");
        }
        const auto val{TryParseHex<uint8_t>(signet_challenge[0])};
        if (!val) {
            throw std::runtime_error(strprintf("-signetchallenge must be hex, not '%s'.", signet_challenge[0]));
        }
        options.challenge.emplace(*val);
    }
}